

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_cte.cpp
# Opt level: O2

void __thiscall duckdb::CTELocalState::~CTELocalState(CTELocalState *this)

{
  (this->super_LocalSinkState)._vptr_LocalSinkState = (_func_int **)&PTR__CTELocalState_017ace88;
  ColumnDataAppendState::~ColumnDataAppendState(&this->append_state);
  ColumnDataCollection::~ColumnDataCollection(&this->lhs_data);
  ::std::unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>::
  ~unique_ptr(&(this->distinct_state).
               super_unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>
             );
  LocalSinkState::~LocalSinkState(&this->super_LocalSinkState);
  return;
}

Assistant:

explicit CTELocalState(ClientContext &context, const PhysicalCTE &op)
	    : lhs_data(context, op.working_table->Types()) {
		lhs_data.InitializeAppend(append_state);
	}